

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

uint64_t VP8LHistogramEstimateBits(VP8LHistogram *h)

{
  int length;
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  iVar4 = 0;
  do {
    length = (1 << ((byte)h->palette_code_bits & 0x1f)) + 0x118;
    if (h->palette_code_bits < 1) {
      length = 0x118;
    }
    uVar3 = PopulationCost(h->literal,length,(uint16_t *)0x0,(uint8_t *)0x0);
    lVar5 = lVar5 + uVar3;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 5);
  uVar1 = (*VP8LExtraCost)(h->literal + 0x100,0x18);
  uVar2 = (*VP8LExtraCost)(h->distance,0x28);
  return (ulong)(uVar2 + uVar1) * 0x800000 + lVar5;
}

Assistant:

uint64_t VP8LHistogramEstimateBits(const VP8LHistogram* const h) {
  int i;
  uint64_t cost = 0;
  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t* population;
    GetPopulationInfo(h, (HistogramIndex)i, &population, &length);
    cost += PopulationCost(population, length, /*trivial_sym=*/NULL,
                           /*is_used=*/NULL);
  }
  cost += ((uint64_t)(VP8LExtraCost(h->literal + NUM_LITERAL_CODES,
                                    NUM_LENGTH_CODES) +
                      VP8LExtraCost(h->distance, NUM_DISTANCE_CODES))
           << LOG_2_PRECISION_BITS);
  return cost;
}